

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_domain(Impl *this)

{
  undefined8 uVar1;
  uint uVar2;
  Builder *this_00;
  MDOperand *md;
  MDNode *node;
  Function *entryPoint;
  void *pvVar3;
  char cVar4;
  char local_1048 [4];
  uint input_control_points;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Function *func;
  TessellatorDomain domain;
  MDNode *arguments;
  MDOperand *ds_state_node;
  Builder *builder;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityTessellation);
  md = get_shader_property_tag(this->entry_point_meta,DSState);
  if (md == (MDOperand *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    node = LLVMBC::cast<LLVMBC::MDNode>(md);
    uVar2 = get_constant_metadata<unsigned_int>(node,0);
    cVar4 = (char)uVar2;
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    if (cVar4 == '\x01') {
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeIsolines,-1,-1,-1);
    }
    else if (cVar4 == '\x02') {
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeTriangles,-1,-1,-1);
    }
    else {
      if (cVar4 != '\x03') {
        buffer._4088_8_ = get_thread_log_callback();
        if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Unknown tessellator domain!\n");
          fflush(_stderr);
        }
        else {
          snprintf(local_1048,0x1000,"Unknown tessellator domain!\n");
          uVar1 = buffer._4088_8_;
          pvVar3 = get_thread_log_callback_userdata();
          (*(code *)uVar1)(pvVar3,2,local_1048);
        }
        return false;
      }
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeQuads,-1,-1,-1);
    }
    uVar2 = get_constant_metadata<unsigned_int>(node,1);
    (this->execution_mode_meta).stage_input_num_vertex = uVar2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_execution_modes_domain()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityTessellation);

	auto *ds_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::DSState);
	if (ds_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*ds_state_node);
		auto domain = static_cast<DXIL::TessellatorDomain>(get_constant_metadata(arguments, 0));
		auto *func = spirv_module.get_entry_function();

		switch (domain)
		{
		case DXIL::TessellatorDomain::IsoLine:
			builder.addExecutionMode(func, spv::ExecutionModeIsolines);
			break;

		case DXIL::TessellatorDomain::Tri:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			break;

		case DXIL::TessellatorDomain::Quad:
			builder.addExecutionMode(func, spv::ExecutionModeQuads);
			break;

		default:
			LOGE("Unknown tessellator domain!\n");
			return false;
		}

		unsigned input_control_points = get_constant_metadata(arguments, 1);
		execution_mode_meta.stage_input_num_vertex = input_control_points;
		return true;
	}
	else
		return false;
}